

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O3

void __thiscall glslang::TOutputTraverser::visitSymbol(TOutputTraverser *this,TIntermSymbol *node)

{
  int *piVar1;
  pointer *pppTVar2;
  int iVar3;
  undefined4 extraout_var;
  TInfoSinkBase *this_00;
  TString TStack_48;
  
  OutputTreeText(this->infoSink,(TIntermNode *)node,(this->super_TIntermTraverser).depth);
  this_00 = &this->infoSink->debug;
  TInfoSinkBase::append(this_00,"\'");
  iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(node);
  TInfoSinkBase::append(this_00,(TString *)CONCAT44(extraout_var,iVar3));
  TInfoSinkBase::append(this_00,"\' (");
  TIntermTyped::getCompleteString_abi_cxx11_(&TStack_48,&node->super_TIntermTyped,false);
  TInfoSinkBase::append(this_00,&TStack_48);
  TInfoSinkBase::append(this_00,")\n");
  if ((node->constArray).unionArray == (TConstUnionVector *)0x0) {
    if (node->constSubtree != (TIntermTyped *)0x0) {
      TIntermTraverser::incrementDepth(&this->super_TIntermTraverser,(TIntermNode *)node);
      (*(node->constSubtree->super_TIntermNode)._vptr_TIntermNode[2])(node->constSubtree,this);
      piVar1 = &(this->super_TIntermTraverser).depth;
      *piVar1 = *piVar1 + -1;
      pppTVar2 = &(this->super_TIntermTraverser).path.
                  super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + -1;
    }
  }
  else {
    OutputConstantUnion(this->infoSink,&node->super_TIntermTyped,&node->constArray,this->extraOutput
                        ,(this->super_TIntermTraverser).depth + 1);
  }
  return;
}

Assistant:

void TOutputTraverser::visitSymbol(TIntermSymbol* node)
{
    OutputTreeText(infoSink, node, depth);

    infoSink.debug << "'" << node->getName() << "' (" << node->getCompleteString() << ")\n";

    if (! node->getConstArray().empty())
        OutputConstantUnion(infoSink, node, node->getConstArray(), extraOutput, depth + 1);
    else if (node->getConstSubtree()) {
        incrementDepth(node);
        node->getConstSubtree()->traverse(this);
        decrementDepth();
    }
}